

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O0

void RescalerImportRowShrink_SSE2(WebPRescaler *wrk,uint8_t *src)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  rescaler_t *prVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ushort uVar12;
  short sVar13;
  int32_t iVar14;
  uint8_t *in_RSI;
  WebPRescaler *in_RDI;
  undefined1 auVar15 [16];
  __m128i G;
  __m128i F2;
  __m128i F1;
  __m128i E2;
  __m128i E1;
  __m128i D2;
  __m128i D1;
  __m128i D0;
  __m128i frow_out;
  __m128i B0;
  __m128i A1;
  __m128i A0;
  __m128i frac;
  __m128i frac1;
  __m128i frac0;
  __m128i mult;
  __m128i A;
  __m128i base;
  rescaler_t *frow_end;
  rescaler_t *frow;
  __m128i sum;
  __m128i rounder;
  __m128i mult1;
  __m128i mult0;
  __m128i zero;
  int accum;
  int x_sub;
  undefined4 uStack_454;
  undefined4 uStack_44c;
  undefined4 uStack_444;
  undefined4 uStack_43c;
  undefined8 local_378;
  rescaler_t *local_360;
  undefined1 local_358 [16];
  int local_308;
  short local_304;
  byte local_288;
  byte bStack_287;
  byte bStack_286;
  byte bStack_285;
  undefined2 local_278;
  undefined2 uStack_276;
  undefined2 uStack_274;
  undefined2 uStack_272;
  undefined2 local_258;
  undefined2 uStack_256;
  undefined2 uStack_254;
  undefined2 uStack_252;
  ushort uStack_1e6;
  ushort uStack_1e4;
  ushort uStack_1e2;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  int iStack_144;
  int iStack_13c;
  int iStack_134;
  int iStack_12c;
  
  iVar1 = in_RDI->x_sub;
  local_308 = 0;
  local_304 = (short)iVar1;
  auVar9._2_2_ = local_304;
  auVar9._0_2_ = local_304;
  auVar9._4_2_ = local_304;
  auVar9._6_2_ = local_304;
  auVar9._10_2_ = local_304;
  auVar9._8_2_ = local_304;
  auVar9._12_2_ = local_304;
  auVar9._14_2_ = local_304;
  uVar2 = in_RDI->fx_scale;
  local_358 = ZEXT816(0);
  local_360 = in_RDI->frow;
  prVar4 = in_RDI->frow;
  iVar3 = in_RDI->dst_width;
  if ((in_RDI->num_channels == 4) && (in_RDI->x_add <= iVar1 * 0x80)) {
    for (; local_360 < prVar4 + (iVar3 << 2); local_360 = local_360 + 4) {
      local_378 = 0;
      local_308 = in_RDI->x_add + local_308;
      while( true ) {
        local_1d8 = local_358._0_2_;
        sStack_1d6 = local_358._2_2_;
        sStack_1d4 = local_358._4_2_;
        sStack_1d2 = local_358._6_2_;
        uStack_1d0 = local_358._8_2_;
        uStack_1ce = local_358._10_2_;
        uStack_1cc = local_358._12_2_;
        uStack_1ca = local_358._14_2_;
        if (local_308 < 1) break;
        iVar14 = WebPMemToInt32((uint8_t *)0x136b65);
        local_288 = (byte)iVar14;
        bStack_287 = (byte)((uint)iVar14 >> 8);
        bStack_286 = (byte)((uint)iVar14 >> 0x10);
        bStack_285 = (byte)((uint)iVar14 >> 0x18);
        local_378._0_2_ = (ushort)local_288;
        uVar12 = (ushort)local_378;
        local_378._0_4_ = (uint)CONCAT12(bStack_287,(ushort)local_378);
        local_378._0_6_ = (uint6)CONCAT14(bStack_286,(uint)local_378);
        local_378 = (ulong)CONCAT16(bStack_285,(uint6)local_378);
        uStack_1e6 = (ushort)bStack_287;
        uStack_1e4 = (ushort)bStack_286;
        uStack_1e2 = (ushort)bStack_285;
        local_358._2_2_ = sStack_1d6 + uStack_1e6;
        local_358._0_2_ = local_1d8 + uVar12;
        local_358._4_2_ = sStack_1d4 + uStack_1e4;
        local_358._6_2_ = sStack_1d2 + uStack_1e2;
        local_358._8_2_ = uStack_1d0;
        local_358._10_2_ = uStack_1ce;
        local_358._12_2_ = uStack_1cc;
        local_358._14_2_ = uStack_1ca;
        local_308 = local_308 - iVar1;
      }
      sVar13 = -(short)local_308;
      auVar15._2_2_ = sVar13;
      auVar15._0_2_ = sVar13;
      auVar15._4_2_ = sVar13;
      auVar15._6_2_ = sVar13;
      auVar15._10_2_ = sVar13;
      auVar15._8_2_ = sVar13;
      auVar15._12_2_ = sVar13;
      auVar15._14_2_ = sVar13;
      local_198 = (short)local_378;
      sStack_196 = (short)(local_378 >> 0x10);
      sStack_194 = (short)(local_378 >> 0x20);
      sStack_192 = (short)(local_378 >> 0x30);
      sStack_196 = sStack_196 * sVar13;
      sStack_192 = sStack_192 * sVar13;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_378;
      auVar15 = pmulhuw(auVar10,auVar15);
      local_258 = auVar15._0_2_;
      uStack_256 = auVar15._2_2_;
      uStack_254 = auVar15._4_2_;
      uStack_252 = auVar15._6_2_;
      auVar15 = pmulhuw(local_358,auVar9);
      local_278 = auVar15._0_2_;
      uStack_276 = auVar15._2_2_;
      uStack_274 = auVar15._4_2_;
      uStack_272 = auVar15._6_2_;
      iVar5 = CONCAT22(local_278,local_1d8 * local_304);
      iVar6 = CONCAT22(uStack_274,sStack_1d4 * local_304);
      iVar7 = CONCAT22(local_258,local_198 * sVar13);
      iVar8 = CONCAT22(uStack_254,sStack_194 * sVar13);
      iStack_134 = (int)(CONCAT26(uStack_276,CONCAT24(sStack_1d6 * local_304,iVar5)) >> 0x20);
      iStack_12c = (int)(CONCAT26(uStack_272,CONCAT24(sStack_1d2 * local_304,iVar6)) >> 0x20);
      iStack_144 = (int)(CONCAT26(uStack_256,CONCAT24(sStack_196,iVar7)) >> 0x20);
      iStack_13c = (int)(CONCAT26(uStack_252,CONCAT24(sStack_192,iVar8)) >> 0x20);
      uStack_444 = (undefined4)
                   (((ulong)CONCAT24(sStack_196,CONCAT22(local_258,local_198 * sVar13)) & 0xffffffff
                    ) * (ulong)uVar2 + 0x80000000 >> 0x20);
      uStack_43c = (undefined4)
                   (((ulong)CONCAT24(sStack_192,CONCAT22(uStack_254,sStack_194 * sVar13)) &
                    0xffffffff) * (ulong)uVar2 + 0x80000000 >> 0x20);
      uStack_454 = (undefined4)
                   ((ulong)CONCAT22(uStack_256,sStack_196) * (ulong)uVar2 + 0x80000000 >> 0x20);
      uStack_44c = (undefined4)
                   ((ulong)CONCAT22(uStack_252,sStack_192) * (ulong)uVar2 + 0x80000000 >> 0x20);
      auVar11._4_4_ = uStack_454;
      auVar11._0_4_ = uStack_444;
      auVar11._12_4_ = uStack_44c;
      auVar11._8_4_ = uStack_43c;
      local_358 = packssdw(auVar11,ZEXT816(0));
      *(ulong *)local_360 = CONCAT44(iStack_134 - iStack_144,iVar5 - iVar7);
      *(ulong *)(local_360 + 2) = CONCAT44(iStack_12c - iStack_13c,iVar6 - iVar8);
    }
  }
  else {
    WebPRescalerImportRowShrink_C(in_RDI,in_RSI);
  }
  return;
}

Assistant:

static void RescalerImportRowShrink_SSE2(WebPRescaler* WEBP_RESTRICT const wrk,
                                         const uint8_t* WEBP_RESTRICT src) {
  const int x_sub = wrk->x_sub;
  int accum = 0;
  const __m128i zero = _mm_setzero_si128();
  const __m128i mult0 = _mm_set1_epi16(x_sub);
  const __m128i mult1 = _mm_set1_epi32(wrk->fx_scale);
  const __m128i rounder = _mm_set_epi32(0, ROUNDER, 0, ROUNDER);
  __m128i sum = zero;
  rescaler_t* frow = wrk->frow;
  const rescaler_t* const frow_end = wrk->frow + 4 * wrk->dst_width;

  if (wrk->num_channels != 4 || wrk->x_add > (x_sub << 7)) {
    WebPRescalerImportRowShrink_C(wrk, src);
    return;
  }
  assert(!WebPRescalerInputDone(wrk));
  assert(!wrk->x_expand);

  for (; frow < frow_end; frow += 4) {
    __m128i base = zero;
    accum += wrk->x_add;
    while (accum > 0) {
      const __m128i A = _mm_cvtsi32_si128(WebPMemToInt32(src));
      src += 4;
      base = _mm_unpacklo_epi8(A, zero);
      // To avoid overflow, we need: base * x_add / x_sub < 32768
      // => x_add < x_sub << 7. That's a 1/128 reduction ratio limit.
      sum = _mm_add_epi16(sum, base);
      accum -= x_sub;
    }
    {    // Emit next horizontal pixel.
      const __m128i mult = _mm_set1_epi16(-accum);
      const __m128i frac0 = _mm_mullo_epi16(base, mult);  // 16b x 16b -> 32b
      const __m128i frac1 = _mm_mulhi_epu16(base, mult);
      const __m128i frac = _mm_unpacklo_epi16(frac0, frac1);  // frac is 32b
      const __m128i A0 = _mm_mullo_epi16(sum, mult0);
      const __m128i A1 = _mm_mulhi_epu16(sum, mult0);
      const __m128i B0 = _mm_unpacklo_epi16(A0, A1);      // sum * x_sub
      const __m128i frow_out = _mm_sub_epi32(B0, frac);   // sum * x_sub - frac
      const __m128i D0 = _mm_srli_epi64(frac, 32);
      const __m128i D1 = _mm_mul_epu32(frac, mult1);      // 32b x 16b -> 64b
      const __m128i D2 = _mm_mul_epu32(D0, mult1);
      const __m128i E1 = _mm_add_epi64(D1, rounder);
      const __m128i E2 = _mm_add_epi64(D2, rounder);
      const __m128i F1 = _mm_shuffle_epi32(E1, 1 | (3 << 2));
      const __m128i F2 = _mm_shuffle_epi32(E2, 1 | (3 << 2));
      const __m128i G = _mm_unpacklo_epi32(F1, F2);
      sum = _mm_packs_epi32(G, zero);
      _mm_storeu_si128((__m128i*)frow, frow_out);
    }
  }
  assert(accum == 0);
}